

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O2

void zip_convert_dos_path(PHYSFS_uint16 entryversion,char *path)

{
  if (0xff < entryversion) {
    return;
  }
  do {
    if (*path == '\\') {
      *path = '/';
    }
    else if (*path == '\0') {
      return;
    }
    path = path + 1;
  } while( true );
}

Assistant:

static void zip_convert_dos_path(const PHYSFS_uint16 entryversion, char *path)
{
    const PHYSFS_uint8 hosttype = (PHYSFS_uint8) ((entryversion >> 8) & 0xFF);
    if (hosttype == 0)  /* FS_FAT_ */
    {
        while (*path)
        {
            if (*path == '\\')
                *path = '/';
            path++;
        } /* while */
    } /* if */
}